

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.h
# Opt level: O2

ON_AerialPhotoImageFrustum * __thiscall
ON_AerialPhotoImageFrustum::operator=
          (ON_AerialPhotoImageFrustum *this,ON_AerialPhotoImageFrustum *param_1)

{
  long lVar1;
  ON_2dPoint *pOVar2;
  ON_2dPoint *pOVar3;
  byte bVar4;
  
  bVar4 = 0;
  ON_UnitSystem::operator=(&this->m_unit_system,&param_1->m_unit_system);
  pOVar2 = (ON_2dPoint *)&param_1->m_height;
  pOVar3 = (ON_2dPoint *)&this->m_height;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar3->x = pOVar2->x;
    pOVar2 = (ON_2dPoint *)&pOVar2[-(ulong)bVar4].y;
    pOVar3 = (ON_2dPoint *)&pOVar3[-(ulong)bVar4].y;
  }
  return this;
}

Assistant:

class ON_CLASS ON_AerialPhotoImageFrustum
{
public:
  ON_AerialPhotoImageFrustum();

  bool IsSet() const;

  bool HeightIsSet() const;
  bool CornersAreSet() const;
  bool UnitSystemIsSet() const;

  void Unset();

  // The frustum unit system must be set. It is common
  // for the frustum unit system to be millimeters.
  ON_UnitSystem m_unit_system;

  // The frustum's apex height must be positive.
  // It is common for the image frustum height
  // to be a camera's focal length.
  double m_height;

  // The corners must be the vertices of a 3 or 4 sided
  // convex region and must have counter-clockwise order
  // in the 2d plane.  It is common for the corners to be
  // a rectangle (lower left, lower right, upper right, 
  // upper left) and for the rectangle to be symmetric
  // about (0,0).  However, when the image has been cropped,
  // the frustum can be skew.  The frustum's apex point is 
  // always directly above (0,0).
  ON_2dPoint m_corners[4];
}